

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

Bucket * __thiscall
Lib::
Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
::insert(Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
         *this,uint *key,Bucket *val,uint code)

{
  MaybeUninit<unsigned_int> MVar1;
  Entry *pEVar2;
  ulong uVar3;
  uint uVar4;
  Entry *pEVar5;
  RealConstantType RStack_58;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *local_38 [2];
  
  pEVar2 = this->_entries;
  uVar3 = (ulong)code % (ulong)(uint)this->_capacity;
  pEVar5 = pEVar2 + uVar3;
  uVar4 = pEVar2[uVar3].code;
  if (uVar4 != 0) {
    do {
      if ((uVar4 == code) && (pEVar5->_key == (MaybeUninit<unsigned_int>)*key)) {
        return (Bucket *)&pEVar5->_value;
      }
      pEVar5 = pEVar5 + 1;
      if (pEVar5 == this->_afterLast) {
        pEVar5 = pEVar2;
      }
      uVar4 = pEVar5->code;
    } while (uVar4 != 0);
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  MVar1 = (MaybeUninit<unsigned_int>)*key;
  Kernel::RealConstantType::RealConstantType(&RStack_58,&val->_sum);
  local_38[0] = (val->_summands)._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                ._M_head_impl;
  (val->_summands)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
  pEVar5->_key = MVar1;
  Kernel::RealConstantType::RealConstantType
            ((RealConstantType *)&(pEVar5->_value).__align,&RStack_58);
  *(Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> **)
   ((long)&pEVar5->_value + 0x20) = local_38[0];
  local_38[0] = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
  pEVar5->code = code;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)local_38);
  mpz_clear(RStack_58.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&RStack_58);
  return (Bucket *)&pEVar5->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }